

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O2

void Abc_GenOneHot(char *pFileName,int nVars)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  FILE *__stream;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  
  __stream = fopen(pFileName,"w");
  pcVar6 = Extra_TimeStamp();
  fprintf(__stream,"# One-hotness condition for %d vars generated by ABC on %s\n",(ulong)(uint)nVars
          ,pcVar6);
  fprintf(__stream,".model 1hot_%dvars\n",(ulong)(uint)nVars);
  fwrite(".inputs",7,1,__stream);
  uVar1 = Abc_Base10Log(nVars);
  uVar2 = 0;
  if (0 < nVars) {
    uVar2 = nVars;
  }
  for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
    fprintf(__stream," i%0*d",(ulong)uVar1,(ulong)uVar9);
  }
  fputc(10,__stream);
  fwrite(".outputs",8,1,__stream);
  iVar3 = nVars + -1;
  uVar9 = (iVar3 * nVars) / 2;
  uVar4 = Abc_Base10Log(uVar9);
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    fprintf(__stream," o%0*d",(ulong)uVar4,(ulong)uVar8);
  }
  fputc(10,__stream);
  uVar7 = 0;
  uVar9 = 0;
  while (uVar9 != uVar2) {
    uVar5 = iVar3 + (int)uVar7;
    for (uVar8 = uVar9 + 1; nVars != uVar8; uVar8 = uVar8 + 1) {
      fprintf(__stream,".names i%0*d i%0*d o%0*d\n",(ulong)uVar1,(ulong)uVar9,(ulong)uVar1,
              (ulong)uVar8,(ulong)uVar4,uVar7);
      fwrite("11 0\n",5,1,__stream);
      uVar7 = (ulong)((int)uVar7 + 1);
    }
    iVar3 = iVar3 + -1;
    uVar7 = (ulong)uVar5;
    uVar9 = uVar9 + 1;
  }
  fwrite(".end\n",5,1,__stream);
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Abc_GenOneHot( char * pFileName, int nVars )
{
    FILE * pFile;
    int i, k, Counter, nDigitsIn, nDigitsOut;
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# One-hotness condition for %d vars generated by ABC on %s\n", nVars, Extra_TimeStamp() );
    fprintf( pFile, ".model 1hot_%dvars\n", nVars );
    fprintf( pFile, ".inputs" );
    nDigitsIn = Abc_Base10Log( nVars );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " i%0*d", nDigitsIn, i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    nDigitsOut = Abc_Base10Log( nVars * (nVars - 1) / 2 );
    for ( i = 0; i < nVars * (nVars - 1) / 2; i++ )
        fprintf( pFile, " o%0*d", nDigitsOut, i );
    fprintf( pFile, "\n" );
    Counter = 0;
    for ( i = 0; i < nVars; i++ )
        for ( k = i+1; k < nVars; k++ )
        {
            fprintf( pFile, ".names i%0*d i%0*d o%0*d\n", nDigitsIn, i, nDigitsIn, k, nDigitsOut, Counter ); 
            fprintf( pFile, "11 0\n" ); 
            Counter++;
        }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
    fclose( pFile );
}